

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFlyNodeAnim(comparer_context *comp)

{
  scoped_chunk sVar1;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  aiString local_450;
  allocator<char> local_39;
  string local_38;
  scoped_chunk local_18;
  scoped_chunk chunk;
  comparer_context *comp_local;
  
  chunk.ctx = comp;
  scoped_chunk::scoped_chunk(&local_18,comp,"aiNodeAnim");
  sVar1.ctx = chunk.ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mNodeName",&local_39);
  comparer_context::cmp<aiString>(&local_450,sVar1.ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"mNumPositionKeys",&local_471);
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"mNumRotationKeys",&local_499);
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"mNumScalingKeys",&local_4c1);
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"mPreState",&local_4e9);
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"mPostState",&local_511);
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"mPositionKeys",&local_539);
  comparer_context::cmp_bounds<aiVectorKey>(sVar1.ctx,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"mRotationKeys",&local_561);
  comparer_context::cmp_bounds<aiQuatKey>(sVar1.ctx,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"mScalingKeys",&local_589)
  ;
  comparer_context::cmp_bounds<aiVectorKey>(sVar1.ctx,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  scoped_chunk::~scoped_chunk(&local_18);
  return;
}

Assistant:

void CompareOnTheFlyNodeAnim(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiNodeAnim");

    comp.cmp<aiString>("mNodeName");
    comp.cmp<uint32_t>("mNumPositionKeys");
    comp.cmp<uint32_t>("mNumRotationKeys");
    comp.cmp<uint32_t>("mNumScalingKeys");
    comp.cmp<uint32_t>("mPreState");
    comp.cmp<uint32_t>("mPostState");

    comp.cmp_bounds<aiVectorKey>("mPositionKeys");
    comp.cmp_bounds<aiQuatKey>("mRotationKeys");
    comp.cmp_bounds<aiVectorKey>("mScalingKeys");
}